

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *target_type,
          BaseType expr_type,string *expr)

{
  pointer pcVar1;
  char (*in_R9) [2];
  SPIRType src_type;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  if (*(BaseType *)&(target_type->super_IVariant).field_0xc == expr_type) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (expr->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + expr->_M_string_length);
  }
  else {
    SPIRType::SPIRType((SPIRType *)local_180,target_type);
    local_180._12_4_ = expr_type;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_1a0,this,target_type,(SPIRType *)local_180)
    ;
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    local_180._0_8_ = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_180._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
      free((void *)local_180._136_8_);
    }
    local_180._96_8_ = 0;
    if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
      free((void *)local_180._88_8_);
    }
    local_180._40_8_ = 0;
    if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
      free((void *)local_180._32_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(const SPIRType &target_type, SPIRType::BaseType expr_type,
                                             const std::string &expr)
{
	if (target_type.basetype == expr_type)
		return expr;

	auto src_type = target_type;
	src_type.basetype = expr_type;
	return join(bitcast_glsl_op(target_type, src_type), "(", expr, ")");
}